

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O3

Vec_Int_t * Gia_ObjSimCands(Gia_SimRsbMan_t *p,int iObj,int nCands)

{
  Gia_Man_t *pGVar1;
  uint uVar2;
  int *piVar3;
  Vec_Int_t *pVVar4;
  Vec_Int_t *pVVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  
  if (iObj < 1) {
    __assert_fail("iObj > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                  ,0x239,"Vec_Int_t *Gia_ObjSimCands(Gia_SimRsbMan_t *, int, int)");
  }
  if (p->pGia->nObjs <= iObj) {
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  uVar2 = (uint)*(undefined8 *)(p->pGia->pObjs + (uint)iObj);
  if (((int)uVar2 < 0) || ((uVar2 & 0x1fffffff) == 0x1fffffff)) {
    __assert_fail("Gia_ObjIsAnd(Gia_ManObj(p->pGia, iObj))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                  ,0x23a,"Vec_Int_t *Gia_ObjSimCands(Gia_SimRsbMan_t *, int, int)");
  }
  p->vCands->nSize = 0;
  pVVar4 = p->vFanins;
  piVar3 = pVVar4->pArray;
  pVVar5 = pVVar4;
  if (pVVar4->nCap < 1) {
    if (piVar3 == (int *)0x0) {
      piVar3 = (int *)malloc(4);
    }
    else {
      piVar3 = (int *)realloc(piVar3,4);
    }
    pVVar4->pArray = piVar3;
    if (piVar3 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    pVVar4->nCap = 1;
    pVVar5 = p->vFanins;
  }
  *piVar3 = iObj;
  pVVar4->nSize = 1;
  iVar6 = pVVar5->nSize;
  do {
    if (iVar6 < 1) {
LAB_007c3571:
      pVVar4 = p->vCands;
      iVar8 = pVVar4->nSize;
      if (iVar6 != 0) {
LAB_007c357c:
        if (iVar8 < nCands) {
          __assert_fail("Vec_IntSize(p->vFanins) == 0 || Vec_IntSize(p->vCands) >= nCands",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                        ,0x246,"Vec_Int_t *Gia_ObjSimCands(Gia_SimRsbMan_t *, int, int)");
        }
      }
      if (nCands < iVar8) {
        pVVar4->nSize = nCands;
      }
      return pVVar4;
    }
    pVVar4 = p->vCands;
    iVar8 = pVVar4->nSize;
    if (nCands <= iVar8) goto LAB_007c357c;
    piVar3 = pVVar5->pArray;
    pGVar1 = p->pGia;
    lVar7 = 0;
    do {
      if (pGVar1->nTravIdsAlloc <= piVar3[lVar7]) {
        __assert_fail("Id < p->nTravIdsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x265,"void Gia_ObjSetTravIdCurrentId(Gia_Man_t *, int)");
      }
      pGVar1->pTravIds[piVar3[lVar7]] = pGVar1->nTravIds;
      lVar7 = lVar7 + 1;
    } while (lVar7 < pVVar5->nSize);
    Gia_ObjSimCollect(p);
    pVVar4 = p->vFanins2;
    iVar6 = pVVar4->nSize;
    if (iVar6 < 1) {
      pVVar5 = p->vFanins;
      p->vFanins = pVVar4;
      p->vFanins2 = pVVar5;
      goto LAB_007c3571;
    }
    pVVar5 = p->vCands;
    lVar7 = 0;
    do {
      Vec_IntPush(pVVar5,pVVar4->pArray[lVar7]);
      lVar7 = lVar7 + 1;
    } while (lVar7 < pVVar4->nSize);
    pVVar4 = p->vFanins;
    pVVar5 = p->vFanins2;
    iVar6 = pVVar5->nSize;
    p->vFanins = pVVar5;
    p->vFanins2 = pVVar4;
  } while( true );
}

Assistant:

Vec_Int_t * Gia_ObjSimCands( Gia_SimRsbMan_t * p, int iObj, int nCands )
{
    assert( iObj > 0 );
    assert( Gia_ObjIsAnd(Gia_ManObj(p->pGia, iObj)) );
    Vec_IntClear( p->vCands );
    Vec_IntFill( p->vFanins, 1, iObj );
    while ( Vec_IntSize(p->vFanins) > 0 && Vec_IntSize(p->vCands) < nCands )
    {
        int i, iTemp;
        Vec_IntForEachEntry( p->vFanins, iTemp, i )
            Gia_ObjSetTravIdCurrentId( p->pGia, iTemp );
        Gia_ObjSimCollect( p ); // p->vFanins -> p->vFanins2
        Vec_IntAppend( p->vCands, p->vFanins2 );
        ABC_SWAP( Vec_Int_t *, p->vFanins, p->vFanins2 );
    }
    assert( Vec_IntSize(p->vFanins) == 0 || Vec_IntSize(p->vCands) >= nCands );
    if ( Vec_IntSize(p->vCands) > nCands )
        Vec_IntShrink( p->vCands, nCands );
    return p->vCands;
}